

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

int __thiscall
tcmalloc::CentralFreeList::RemoveRange(CentralFreeList *this,void **start,void **end,int N)

{
  int iVar1;
  int iVar2;
  SizeMap *this_00;
  void *local_50;
  void *tail;
  void *head;
  int n;
  int result;
  TCEntry *entry;
  int slot;
  int N_local;
  void **end_local;
  void **start_local;
  CentralFreeList *this_local;
  
  entry._4_4_ = N;
  _slot = end;
  end_local = start;
  start_local = (void **)this;
  SpinLock::Lock(&this->lock_);
  iVar1 = entry._4_4_;
  this_00 = Static::sizemap();
  iVar2 = SizeMap::num_objects_to_move(this_00,(uint32_t)this->size_class_);
  if ((iVar1 == iVar2) && (0 < this->used_slots_)) {
    entry._0_4_ = this->used_slots_ + -1;
    this->used_slots_ = (int)entry;
    _n = this->tc_slots_ + (int)entry;
    *end_local = _n->head;
    *_slot = _n->tail;
    SpinLock::Unlock(&this->lock_);
    this_local._4_4_ = entry._4_4_;
  }
  else {
    head._4_4_ = 0;
    *end_local = (void *)0x0;
    *_slot = (void *)0x0;
    head._4_4_ = FetchFromOneSpansSafe(this,entry._4_4_,end_local,_slot);
    if (head._4_4_ != 0) {
      while (head._4_4_ < entry._4_4_) {
        tail = (void *)0x0;
        local_50 = (void *)0x0;
        head._0_4_ = FetchFromOneSpans(this,entry._4_4_ - head._4_4_,&tail,&local_50);
        if ((int)head == 0) break;
        head._4_4_ = (int)head + head._4_4_;
        SLL_PushRange(end_local,tail,local_50);
      }
    }
    SpinLock::Unlock(&this->lock_);
    this_local._4_4_ = head._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int CentralFreeList::RemoveRange(void **start, void **end, int N) {
  ASSERT(N > 0);
  lock_.Lock();
  if (N == Static::sizemap()->num_objects_to_move(size_class_) &&
      used_slots_ > 0) {
    int slot = --used_slots_;
    ASSERT(slot >= 0);
    TCEntry *entry = &tc_slots_[slot];
    *start = entry->head;
    *end = entry->tail;
    lock_.Unlock();
    return N;
  }

  int result = 0;
  *start = nullptr;
  *end = nullptr;
  // TODO: Prefetch multiple TCEntries?
  result = FetchFromOneSpansSafe(N, start, end);
  if (result != 0) {
    while (result < N) {
      int n;
      void* head = nullptr;
      void* tail = nullptr;
      n = FetchFromOneSpans(N - result, &head, &tail);
      if (!n) break;
      result += n;
      SLL_PushRange(start, head, tail);
    }
  }
  lock_.Unlock();
  return result;
}